

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O1

void __thiscall QFileSystemComboBox::setCurrentFilePath(QFileSystemComboBox *this,QString *filePath)

{
  QFileSystemComboBoxPrivate *pQVar1;
  bool bVar2;
  QFileInfo fileInfo;
  QFileInfo local_70 [8];
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  bool local_40;
  int local_38;
  QFileInfo local_30 [8];
  
  QFileInfo::QFileInfo(local_70,filePath);
  QFileSystemListView::rootPath((QString *)local_68,this->d->view);
  QFileInfo::absolutePath();
  bVar2 = operator==((QString *)local_68,(QString *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  pQVar1 = this->d;
  if (bVar2) {
    if ((pQVar1->initialSorting != false) ||
       ((pQVar1->layoutValue).super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>.
        _M_payload.super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>.
        super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_engaged == true)) {
      local_68._0_4_ = -1;
      QFileInfo::QFileInfo((QFileInfo *)(local_68 + 8),local_70);
      std::optional<std::pair<int,QFileInfo>>::operator=
                ((optional<std::pair<int,QFileInfo>> *)&this->d->layoutValue,
                 (pair<int,_QFileInfo> *)local_68);
      QFileInfo::~QFileInfo((QFileInfo *)(local_68 + 8));
      goto LAB_00182367;
    }
    QFileInfo::fileName();
    findFileName(this,(QString *)local_68,(MatchFlags)0x10);
    QComboBox::setCurrentIndex((int)this);
  }
  else {
    QFileInfo::absolutePath();
    local_38 = -1;
    QFileInfo::QFileInfo(local_30,local_70);
    local_50._0_4_ = local_38;
    QFileInfo::QFileInfo((QFileInfo *)(local_50 + 8),local_30);
    local_40 = true;
    pQVar1->initialSorting = true;
    std::_Optional_payload_base<std::pair<int,_QFileInfo>_>::_M_copy_assign
              ((_Optional_payload_base<std::pair<int,_QFileInfo>_> *)&pQVar1->layoutValue,
               (_Optional_payload_base<std::pair<int,_QFileInfo>_> *)local_50);
    QFileSystemListView::setRootPath(pQVar1->view,(QString *)local_68);
    if (local_40 == true) {
      local_40 = false;
      QFileInfo::~QFileInfo((QFileInfo *)(local_50 + 8));
    }
    QFileInfo::~QFileInfo(local_30);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
LAB_00182367:
  QFileInfo::~QFileInfo(local_70);
  return;
}

Assistant:

void QFileSystemComboBox::setCurrentFilePath(const QString &filePath) {
    const QFileInfo fileInfo(filePath);

    if (rootPath() != fileInfo.absolutePath()) {
        d->setRootPath(fileInfo.absolutePath(), qMakePair(-1, fileInfo));
    } else {
        if (d->initialSorting || d->layoutValue) {
            d->layoutValue = qMakePair(-1, fileInfo);
        } else {
            setCurrentIndex(findFileName(fileInfo.fileName()));
        }
    }
}